

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

CMbuffer cm_create_transport_and_link_buffer(CManager_conflict cm,void *buffer,ssize_t length)

{
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  CManager unaff_retaddr;
  timespec ts;
  CMbuffer tmp;
  size_t in_stack_ffffffffffffffc0;
  FILE *__stream;
  timespec local_30;
  CMbuffer local_20;
  size_t local_18;
  void *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = (CMbuffer)INT_CMmalloc(in_stack_ffffffffffffffc0);
  memset(local_20,0,0x30);
  local_20->buffer = local_10;
  local_20->size = local_18;
  local_20->ref_count = 1;
  iVar1 = CMtrace_val[9];
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init(unaff_retaddr,(CMTraceType)((ulong)in_RDI >> 0x20));
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      __stream = *(FILE **)(in_RDI + 0x120);
      _Var2 = getpid();
      pVar3 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_30);
      fprintf(*(FILE **)(in_RDI + 0x120),"%lld.%.9ld - ",local_30.tv_sec,local_30.tv_nsec);
    }
    fprintf(*(FILE **)(in_RDI + 0x120),"Create and link buffer %p, ref_count is %d\n",local_20,
            (ulong)(uint)local_20->ref_count);
  }
  fflush(*(FILE **)(in_RDI + 0x120));
  local_20->next = *(_CMbuffer **)(in_RDI + 0xe8);
  *(CMbuffer *)(in_RDI + 0xe8) = local_20;
  return local_20;
}

Assistant:

extern CMbuffer
 cm_create_transport_and_link_buffer(CManager cm, void *buffer, ssize_t length)
 {
     CMbuffer tmp;
     tmp = INT_CMmalloc(sizeof(*tmp));
     memset(tmp, 0, sizeof(*tmp));
     tmp->buffer = buffer;
     tmp->size = length;
     tmp->ref_count = 1;
     CMtrace_out(cm, CMBufferVerbose, "Create and link buffer %p, ref_count is %d\n", tmp, tmp->ref_count);
     tmp->next = cm->cm_buffer_list;
     cm->cm_buffer_list = tmp;
     return tmp;
 }